

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O1

string * __thiscall
Corrade::Utility::Implementation::IntegerConfigurationValue<int>::toString_abi_cxx11_
          (string *__return_storage_ptr__,IntegerConfigurationValue<int> *this,int *value,
          ConfigurationValueFlags flags)

{
  uint *puVar1;
  uint uVar2;
  ostringstream stream;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  uVar2 = 8;
  if ((((ulong)value & 2) != 0) || (uVar2 = 0x40, ((ulong)value & 1) != 0)) {
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | uVar2;
  }
  if (((ulong)value & 8) != 0) {
    puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
  }
  std::ostream::operator<<(local_190,*(int *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerConfigurationValue<T>::toString(const T& value, ConfigurationValueFlags flags) {
        std::ostringstream stream;

        /* Hexadecimal / octal values */
        if(flags & ConfigurationValueFlag::Hex)
            stream.setf(std::istringstream::hex, std::istringstream::basefield);
        else if(flags & ConfigurationValueFlag::Oct)
            stream.setf(std::istringstream::oct, std::istringstream::basefield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        stream << value;
        return stream.str();
    }